

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O2

bool __thiscall
chrono::collision::ChCollisionModelBullet::AddCapsule
          (ChCollisionModelBullet *this,shared_ptr<chrono::ChMaterialSurface> *material,
          double radius,double hlen,ChVector<double> *pos,ChMatrix33<double> *rot)

{
  undefined1 auVar1 [16];
  ChCollisionShapeBullet *this_00;
  cbtCollisionShape *this_01;
  float fVar2;
  float fVar3;
  double dVar4;
  undefined8 in_XMM0_Qb;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  dVar4 = radius;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x23])();
  auVar6._8_8_ = 0;
  auVar6._0_8_ = radius;
  auVar5._0_8_ = (double)SUB84(dVar4,0);
  auVar5._8_8_ = in_XMM0_Qb;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = hlen;
  auVar1 = vminsd_avx(auVar6,auVar1);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = auVar1._0_8_ * 0.2;
  auVar1 = vminsd_avx(auVar5,auVar7);
  fVar2 = auVar1._0_4_;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x22])(this);
  this_00 = (ChCollisionShapeBullet *)::operator_new(0x28);
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  ChCollisionShapeBullet::ChCollisionShapeBullet
            (this_00,CAPSULE,(shared_ptr<chrono::ChMaterialSurface> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x25])(this);
  fVar3 = (float)((double)fVar2 + radius);
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x25])(this);
  this_01 = (cbtCollisionShape *)cbtCapsuleShape::operator_new(0x48);
  cbtCapsuleShape::cbtCapsuleShape
            ((cbtCapsuleShape *)this_01,(float)((double)fVar2 + radius),
             (float)((double)fVar3 + hlen) + (float)((double)fVar3 + hlen));
  this_00->m_bt_shape = this_01;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x2b])(this);
  (*this_01->_vptr_cbtCollisionShape[0xb])(this_01);
  injectShape(this,pos,rot,this_00);
  return true;
}

Assistant:

bool ChCollisionModelBullet::AddCapsule(std::shared_ptr<ChMaterialSurface> material,
                                        double radius,
                                        double hlen,
                                        const ChVector<>& pos,
                                        const ChMatrix33<>& rot) {
    // adjust default inward margin (if object too thin)
    SetSafeMargin(ChMin(GetSafeMargin(), 0.2 * ChMin(radius, hlen)));

    auto shape = new ChCollisionShapeBullet(ChCollisionShape::Type::CAPSULE, material);

    cbtScalar ar = (cbtScalar)(radius + GetEnvelope());
    cbtScalar ah = (cbtScalar)(hlen + GetEnvelope());
    shape->m_bt_shape = new cbtCapsuleShape(ar, 2 * ah);
    shape->m_bt_shape->setMargin((cbtScalar)GetSuggestedFullMargin());

    injectShape(pos, rot, shape);
    return true;
}